

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolynomialNormalizer.cpp
# Opt level: O1

NormalizationResult * __thiscall
Kernel::normalizeAdd<Kernel::NumTraits<Kernel::RationalConstantType>>
          (NormalizationResult *__return_storage_ptr__,Kernel *this,NormalizationResult *lhs,
          NormalizationResult *rhs)

{
  char *pcVar1;
  PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_> *x;
  InnerType *pIVar2;
  IntegerConstantType *pIVar3;
  Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *pMVar4;
  byte bVar5;
  byte bVar6;
  Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_> *r;
  Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_> *l;
  RefIterator it;
  Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_> summands;
  RenderMonom local_129;
  Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_> local_128;
  Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> local_108;
  Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> local_d8;
  Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> local_a8;
  Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> local_78;
  Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_> local_48;
  
  bVar5 = (byte)*this & 7;
  if ((bVar5 == 5) &&
     ((undefined1  [52])
      ((undefined1  [52])
       (lhs->_inner).
       super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
       .
       super_RawCoproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>
      & (undefined1  [52])0x7) == (undefined1  [52])0x2)) {
    RenderMonom::operator()
              (&local_78,(RenderMonom *)&local_128,
               (PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)(this + 1));
    if (*(long *)((lhs->_inner).
                  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
                  .
                  super_RawCoproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>
                  ._content + 0x10) ==
        *(long *)((lhs->_inner).
                  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
                  .
                  super_RawCoproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>
                  ._content + 0x18)) {
      ::Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::expand
                ((Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_> *)
                 (lhs->_inner).
                 super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
                 .
                 super_RawCoproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>
                 ._content);
    }
    pIVar3 = *(IntegerConstantType **)
              ((lhs->_inner).
               super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
               .
               super_RawCoproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>
               ._content + 0x10);
    IntegerConstantType::IntegerConstantType(pIVar3,(IntegerConstantType *)&local_78);
    pIVar2 = &local_78.numeral._den;
    IntegerConstantType::IntegerConstantType(pIVar3 + 1,pIVar2);
    pIVar3[2]._val[0]._mp_alloc = local_78.factors._id;
    pIVar3[2]._val[0]._mp_d = (mp_limb_t *)local_78.factors._ptr;
    pcVar1 = (lhs->_inner).
             super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
             .
             super_RawCoproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>
             ._content + 0x10;
    *(long *)pcVar1 = *(long *)pcVar1 + 0x30;
    mpz_clear(pIVar2->_val);
    mpz_clear((__mpz_struct *)&local_78);
  }
  else {
    bVar6 = *(byte *)&(lhs->_inner).
                      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
                      .
                      super_RawCoproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>
            & 7 ^ 5;
    if (bVar5 == 2 && bVar6 == 0) {
      RenderMonom::operator()
                (&local_a8,(RenderMonom *)&local_128,
                 (PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)
                 (lhs->_inner).
                 super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
                 .
                 super_RawCoproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>
                 ._content);
      if (*(long *)(this + 0x11) == *(long *)(this + 0x19)) {
        ::Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::expand
                  ((Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_> *)
                   (this + 1));
      }
      pIVar3 = *(IntegerConstantType **)(this + 0x11);
      IntegerConstantType::IntegerConstantType(pIVar3,(IntegerConstantType *)&local_a8);
      pIVar2 = &local_a8.numeral._den;
      IntegerConstantType::IntegerConstantType(pIVar3 + 1,pIVar2);
      pIVar3[2]._val[0]._mp_alloc = local_a8.factors._id;
      pIVar3[2]._val[0]._mp_d = (mp_limb_t *)local_a8.factors._ptr;
      *(long *)(this + 0x11) = *(long *)(this + 0x11) + 0x30;
      mpz_clear(pIVar2->_val);
      mpz_clear((__mpz_struct *)&local_a8);
      lhs = (NormalizationResult *)this;
    }
    else {
      x = (PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)(this + 1);
      pcVar1 = (lhs->_inner).
               super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
               .
               super_RawCoproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>
               ._content;
      if (bVar5 == 5 && bVar6 == 0) {
        local_128._capacity = 2;
        local_128._stack =
             (Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)::operator_new(0x60,0x10);
        local_128._end = local_128._stack + local_128._capacity;
        local_128._cursor = local_128._stack;
        RenderMonom::operator()(&local_d8,&local_129,x);
        if (local_128._cursor == local_128._end) {
          ::Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::expand
                    (&local_128);
        }
        pMVar4 = local_128._cursor;
        IntegerConstantType::IntegerConstantType
                  ((IntegerConstantType *)local_128._cursor,(IntegerConstantType *)&local_d8);
        pIVar2 = &local_d8.numeral._den;
        IntegerConstantType::IntegerConstantType(&(pMVar4->numeral)._den,pIVar2);
        (pMVar4->factors)._id = local_d8.factors._id;
        (pMVar4->factors)._ptr = local_d8.factors._ptr;
        local_128._cursor = local_128._cursor + 1;
        mpz_clear(pIVar2->_val);
        mpz_clear((__mpz_struct *)&local_d8);
        RenderMonom::operator()
                  (&local_108,&local_129,
                   (PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)pcVar1);
        if (local_128._cursor == local_128._end) {
          ::Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::expand
                    (&local_128);
        }
        pMVar4 = local_128._cursor;
        IntegerConstantType::IntegerConstantType
                  ((IntegerConstantType *)local_128._cursor,(IntegerConstantType *)&local_108);
        pIVar2 = &local_108.numeral._den;
        IntegerConstantType::IntegerConstantType(&(pMVar4->numeral)._den,pIVar2);
        (pMVar4->factors)._id = local_108.factors._id;
        (pMVar4->factors)._ptr = local_108.factors._ptr;
        local_128._cursor = local_128._cursor + 1;
        mpz_clear(pIVar2->_val);
        mpz_clear((__mpz_struct *)&local_108);
        Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>::Polynom
                  ((Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)&local_48,&local_128
                  );
        ::Lib::
        Coproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>
        ::Coproduct<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_0>
                  (__return_storage_ptr__,
                   (Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)&local_48);
        ::Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::~Stack
                  (&local_48);
        ::Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::~Stack
                  (&local_128);
        return __return_storage_ptr__;
      }
      ::Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::reserve
                ((Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_> *)x,
                 (*(long *)((lhs->_inner).
                            super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
                            .
                            super_RawCoproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>
                            ._content + 0x10) -
                  *(long *)((lhs->_inner).
                            super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
                            .
                            super_RawCoproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>
                            ._content + 8) >> 4) * -0x5555555555555555 +
                 (*(long *)(this + 0x11) - *(long *)(this + 9) >> 4) * -0x5555555555555555);
      it._stack = (Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_> *)pcVar1;
      it._pointer = *(Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> **)
                     ((lhs->_inner).
                      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
                      .
                      super_RawCoproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>
                      ._content + 0x10);
      ::Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>>>::
      loadFromIterator<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>>>::RefIterator>
                ((Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>>> *)x,it);
      lhs = (NormalizationResult *)this;
    }
  }
  ::Lib::CoproductImpl::TrivialOperations::MoveCons::
  DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::PolyNf,_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::PreMonom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
  ::DefaultImpl(&__return_storage_ptr__->_inner,&lhs->_inner);
  return __return_storage_ptr__;
}

Assistant:

NormalizationResult normalizeAdd(NormalizationResult& lhs, NormalizationResult& rhs) {
  using Polynom = Polynom<NumTraits>;
  using Monom = Monom<NumTraits>;
  using PreMonom = PreMonom<NumTraits>;
  ASS(lhs.is<Polynom>() || lhs.is<PreMonom>())
  ASS(rhs.is<Polynom>() || rhs.is<PreMonom>())

  if (lhs.is<PreMonom>() && rhs.is<Polynom>())  {
    auto& l = lhs.unwrap<PreMonom>();
    auto& r = rhs.unwrap<Polynom>();
    /* Monom(...) + Polynom(x0, x1, ...) ==> Polynom(x0, x1, ..., Monom(...)) */
    r.raw().push(RenderMonom{}(std::move(l)));
    return std::move(rhs);

  } else if (rhs.is<PreMonom>() && lhs.is<Polynom>()){
    auto& r = rhs.unwrap<PreMonom>();
    auto& l = lhs.unwrap<Polynom>();

    /*  Polynom(x0, x1, ...) + Monom(...) ==> Polynom(x0, x1, ..., Monom(...)) */
    l.raw().push(RenderMonom{}(std::move(r)));
    return std::move(lhs);

  } else if (lhs.is<PreMonom>() && rhs.is<PreMonom>()) {
    auto& l = lhs.unwrap<PreMonom>();
    auto& r = rhs.unwrap<PreMonom>();

    /* Monom(x0, x1, ...) + Monom(y0, y1, ...) ==> Polynom(Monom(x0, x1, ...), Polynom(y0, y1, ...)) */
    Stack<Monom> summands(2);
    summands.push(RenderMonom{}(std::move(l)));
    summands.push(RenderMonom{}(std::move(r)));
    return NormalizationResult(Polynom(std::move(summands)));

  } else{
    ASS(lhs.is<Polynom>())
    ASS(rhs.is<Polynom>())
    auto& l = lhs.unwrap<Polynom>();
    auto& r = rhs.unwrap<Polynom>();

    /* Polynom(x0, x1, ...) + Polynom(y0, y1, ...) ==> Polynom(x0, x1, ..., y0, y1, ...) */
    l.raw().reserve(l.raw().size() + r.raw().size());
    l.raw().loadFromIterator(r.raw().iter());
    return std::move(lhs);
  }
}